

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O3

pcp_flow_t *
pcp_learn_dscp(pcp_ctx_t *ctx,uint8_t delay_tol,uint8_t loss_tol,uint8_t jitter_tol,char *app_name)

{
  flow_key_data kd;
  undefined8 *local_98;
  undefined8 local_90;
  pcp_flow_t *ppStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined8 uStack_14;
  
  local_80 = 0;
  local_60 = 0;
  local_98 = &local_58;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  uStack_18 = 0;
  uStack_14 = 0;
  local_58 = 3;
  local_90 = 0;
  ppStack_88 = (pcp_flow_t *)0x0;
  uStack_78 = 0;
  local_70 = (ulong)(byte)((jitter_tol & 3) << 2 | (loss_tol & 3) << 4 | delay_tol << 6);
  pcStack_68 = app_name;
  pcp_db_foreach_server(ctx,chain_and_assign_src_ip,&local_98);
  return ppStack_88;
}

Assistant:

pcp_flow_t *pcp_learn_dscp(pcp_ctx_t *ctx, uint8_t delay_tol, uint8_t loss_tol,
                           uint8_t jitter_tol, char *app_name) {
    struct flow_key_data kd;
    struct caasi_data data;

    memset(&data, 0, sizeof(data));
    memset(&kd, 0, sizeof(kd));

    kd.operation = PCP_OPCODE_SADSCP;

    data.fprev = NULL;
    data.kd = &kd;
    data.ffirst = NULL;
    data.lifetime = 0;
    data.ext_addr = NULL;
    data.toler_fields =
        (delay_tol & 3) << 6 | ((loss_tol & 3) << 4) | ((jitter_tol & 3) << 2);
    data.app_name = app_name;

    pcp_db_foreach_server(ctx, chain_and_assign_src_ip, &data);

    return data.ffirst;
}